

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcol.c
# Opt level: O2

int ffpcn(fitsfile *fptr,int datatype,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem
         ,void *array,void *nulval,int *status)

{
  if (0 < *status) {
    return *status;
  }
  if (nulval == (void *)0x0) {
    ffpcl(fptr,datatype,colnum,firstrow,firstelem,nelem,array,status);
    goto LAB_001d017c;
  }
  switch(datatype) {
  case 0xb:
    ffpcnb(fptr,colnum,firstrow,firstelem,nelem,(uchar *)array,*nulval,status);
    break;
  case 0xc:
    ffpcnsb(fptr,colnum,firstrow,firstelem,nelem,(char *)array,*nulval,status);
    break;
  case 0xd:
  case 0xf:
  case 0x11:
  case 0x12:
  case 0x13:
switchD_001d018e_caseD_d:
    *status = 0x19a;
    break;
  case 0xe:
    ffpcnl(fptr,colnum,firstrow,firstelem,nelem,(char *)array,*nulval,status);
    break;
  case 0x10:
    ffpcns(fptr,colnum,firstrow,firstelem,nelem,(char **)array,(char *)nulval,status);
    break;
  case 0x14:
    ffpcnui(fptr,colnum,firstrow,firstelem,nelem,(unsigned_short *)array,*nulval,status);
    break;
  case 0x15:
    ffpcni(fptr,colnum,firstrow,firstelem,nelem,(short *)array,*nulval,status);
    break;
  default:
    switch(datatype) {
    case 0x50:
      ffpcnujj(fptr,colnum,firstrow,firstelem,nelem,(ULONGLONG *)array,*nulval,status);
      break;
    case 0x51:
      ffpcnjj(fptr,colnum,firstrow,firstelem,nelem,(LONGLONG *)array,*nulval,status);
      break;
    case 0x53:
      firstelem = firstelem * 2 + -1;
      nelem = nelem * 2;
LAB_001d0333:
      ffpcne(fptr,colnum,firstrow,firstelem,nelem,(float *)array,*nulval,status);
      break;
    default:
      if (datatype == 0x1e) {
        ffpcnuk(fptr,colnum,firstrow,firstelem,nelem,(uint *)array,*nulval,status);
        break;
      }
      if (datatype == 0x1f) {
        ffpcnk(fptr,colnum,firstrow,firstelem,nelem,(int *)array,*nulval,status);
        break;
      }
      if (datatype == 0x28) {
        ffpcnuj(fptr,colnum,firstrow,firstelem,nelem,(unsigned_long *)array,*nulval,status);
        break;
      }
      if (datatype == 0x29) {
        ffpcnj(fptr,colnum,firstrow,firstelem,nelem,(long *)array,*nulval,status);
        break;
      }
      if (datatype == 0x2a) goto LAB_001d0333;
      if (datatype != 0xa3) goto switchD_001d018e_caseD_d;
      firstelem = firstelem * 2 + -1;
      nelem = nelem * 2;
    case 0x52:
      ffpcnd(fptr,colnum,firstrow,firstelem,nelem,(double *)array,*nulval,status);
    }
  }
LAB_001d017c:
  return *status;
}

Assistant:

int ffpcn(  fitsfile *fptr,  /* I - FITS file pointer                       */
            int  datatype,   /* I - datatype of the value                   */
            int  colnum,     /* I - number of column to write (1 = 1st col) */
            LONGLONG  firstrow,  /* I - first row to write (1 = 1st row)        */
            LONGLONG  firstelem, /* I - first vector element to write (1 = 1st) */
            LONGLONG  nelem,     /* I - number of elements to write             */
            void  *array,    /* I - array of values that are written        */
            void  *nulval,   /* I - pointer to the null value               */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to a table column.  The datatype of the
  input array is defined by the 2nd argument. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS column is not the same as the array being written).

*/
{
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (nulval == NULL)  /* null value not defined? */
    {
        ffpcl(fptr, datatype, colnum, firstrow, firstelem, nelem, array,
              status);
        return(*status);
    }

    if (datatype == TBYTE)
    {
      ffpcnb(fptr, colnum, firstrow, firstelem, nelem, (unsigned char *) array,
            *(unsigned char *) nulval, status);
    }
    else if (datatype == TSBYTE)
    {
      ffpcnsb(fptr, colnum, firstrow, firstelem, nelem, (signed char *) array,
            *(signed char *) nulval, status);
    }
    else if (datatype == TUSHORT)
    {
     ffpcnui(fptr, colnum, firstrow, firstelem, nelem, (unsigned short *) array,
             *(unsigned short *) nulval, status);
    }
    else if (datatype == TSHORT)
    {
      ffpcni(fptr, colnum, firstrow, firstelem, nelem, (short *) array,
             *(unsigned short *) nulval, status);
    }
    else if (datatype == TUINT)
    {
      ffpcnuk(fptr, colnum, firstrow, firstelem, nelem, (unsigned int *) array,
             *(unsigned int *) nulval, status);
    }
    else if (datatype == TINT)
    {
      ffpcnk(fptr, colnum, firstrow, firstelem, nelem, (int *) array,
             *(int *) nulval, status);
    }
    else if (datatype == TULONG)
    {
      ffpcnuj(fptr, colnum, firstrow, firstelem, nelem, (unsigned long *) array,
              *(unsigned long *) nulval, status);
    }
    else if (datatype == TLONG)
    {
      ffpcnj(fptr, colnum, firstrow, firstelem, nelem, (long *) array,
             *(long *) nulval, status);
    }
    else if (datatype == TULONGLONG)
    {
      ffpcnujj(fptr, colnum, firstrow, firstelem, nelem, (ULONGLONG *) array,
             *(ULONGLONG *) nulval, status);
    }
    else if (datatype == TLONGLONG)
    {
      ffpcnjj(fptr, colnum, firstrow, firstelem, nelem, (LONGLONG *) array,
             *(LONGLONG *) nulval, status);
    }
    else if (datatype == TFLOAT)
    {
      ffpcne(fptr, colnum, firstrow, firstelem, nelem, (float *) array,
             *(float *) nulval, status);
    }
    else if (datatype == TDOUBLE)
    {
      ffpcnd(fptr, colnum, firstrow, firstelem, nelem, (double *) array,
             *(double *) nulval, status);
    }
    else if (datatype == TCOMPLEX)
    {
      ffpcne(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
             (float *) array, *(float *) nulval, status);
    }
    else if (datatype == TDBLCOMPLEX)
    {
      ffpcnd(fptr, colnum, firstrow, (firstelem - 1) * 2 + 1, nelem * 2,
             (double *) array, *(double *) nulval, status);
    }
    else if (datatype == TLOGICAL)
    {
      ffpcnl(fptr, colnum, firstrow, firstelem, nelem, (char *) array,
             *(char *) nulval, status);
    }
    else if (datatype == TSTRING)
    {
      ffpcns(fptr, colnum, firstrow, firstelem, nelem, (char **) array,
             (char *) nulval, status);
    }
    else
      *status = BAD_DATATYPE;

    return(*status);
}